

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O1

void helics::addOperations(Translator *trans,TranslatorTypes type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  shared_ptr<helics::JsonTranslatorOperation> operation;
  undefined1 local_49;
  BinaryTranslatorOperation *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<helics::TranslatorOperations> local_38;
  shared_ptr<helics::TranslatorOperations> local_28;
  
  if (type == BINARY) {
    local_48 = (BinaryTranslatorOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::BinaryTranslatorOperation,std::allocator<helics::BinaryTranslatorOperation>>
              (&_Stack_40,&local_48,(allocator<helics::BinaryTranslatorOperation> *)&local_49);
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_48->super_TranslatorOperations;
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_40._M_pi;
    local_48 = (BinaryTranslatorOperation *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Translator::setTranslatorOperations(trans,&local_38);
    this._M_pi = local_38.
                 super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  }
  else {
    if (type != JSON) {
      return;
    }
    local_48 = (BinaryTranslatorOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::JsonTranslatorOperation,std::allocator<helics::JsonTranslatorOperation>>
              (&_Stack_40,(JsonTranslatorOperation **)&local_48,
               (allocator<helics::JsonTranslatorOperation> *)&local_49);
    local_28.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_48->super_TranslatorOperations;
    local_28.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_40._M_pi;
    local_48 = (BinaryTranslatorOperation *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Translator::setTranslatorOperations(trans,&local_28);
    this._M_pi = local_28.
                 super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  return;
}

Assistant:

void addOperations(Translator* trans, TranslatorTypes type)
{
    switch (type) {
        case TranslatorTypes::CUSTOM:
        default:
            break;
        case TranslatorTypes::JSON: {
            auto operation = std::make_shared<JsonTranslatorOperation>();
            trans->setTranslatorOperations(std::move(operation));
        } break;
        case TranslatorTypes::BINARY: {
            auto operation = std::make_shared<BinaryTranslatorOperation>();
            trans->setTranslatorOperations(std::move(operation));
        } break;
    }
}